

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

XThreadEvent ** __thiscall
kj::Vector<kj::_::XThreadEvent*>::add<kj::_::XThreadEvent*>
          (Vector<kj::_::XThreadEvent*> *this,XThreadEvent **params)

{
  bool bVar1;
  XThreadEvent **ppXVar2;
  XThreadEvent **params_local;
  Vector<kj::_::XThreadEvent_*> *this_local;
  
  bVar1 = ArrayBuilder<kj::_::XThreadEvent_*>::isFull((ArrayBuilder<kj::_::XThreadEvent_*> *)this);
  if (bVar1) {
    Vector<kj::_::XThreadEvent_*>::grow((Vector<kj::_::XThreadEvent_*> *)this,0);
  }
  ppXVar2 = fwd<kj::_::XThreadEvent*>(params);
  ppXVar2 = ArrayBuilder<kj::_::XThreadEvent*>::add<kj::_::XThreadEvent*>
                      ((ArrayBuilder<kj::_::XThreadEvent*> *)this,ppXVar2);
  return ppXVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }